

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&> * __thiscall
Catch::ExprLhs<protozero::data_view_const&>::operator<=
          (BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&>
           *__return_storage_ptr__,ExprLhs<protozero::data_view_const&> *this,data_view *rhs)

{
  data_view *pdVar1;
  bool comparisonResult;
  StringRef local_50;
  char *local_40;
  size_t local_38;
  char *local_30;
  size_t local_28;
  data_view *local_20;
  data_view *rhs_local;
  ExprLhs<const_protozero::data_view_&> *this_local;
  
  pdVar1 = *(data_view **)this;
  local_30 = pdVar1->m_data;
  local_28 = pdVar1->m_size;
  local_40 = rhs->m_data;
  local_38 = rhs->m_size;
  local_20 = rhs;
  rhs_local = (data_view *)this;
  this_local = (ExprLhs<const_protozero::data_view_&> *)__return_storage_ptr__;
  comparisonResult = protozero::operator<=(*pdVar1,*rhs);
  pdVar1 = *(data_view **)this;
  StringRef::StringRef(&local_50,"<=");
  BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,pdVar1,local_50,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }